

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  Curl_addrinfo *pCVar1;
  size_t local_78;
  size_t namelen;
  ulong uStack_60;
  int error;
  size_t ss_size;
  Curl_addrinfo *ca;
  Curl_addrinfo *calast;
  Curl_addrinfo *cafirst;
  addrinfo *aihead;
  addrinfo *ai;
  Curl_addrinfo **result_local;
  addrinfo *hints_local;
  char *servname_local;
  char *nodename_local;
  
  calast = (Curl_addrinfo *)0x0;
  ca = (Curl_addrinfo *)0x0;
  *result = (Curl_addrinfo *)0x0;
  ai = (addrinfo *)result;
  result_local = (Curl_addrinfo **)hints;
  hints_local = (addrinfo *)servname;
  servname_local = nodename;
  namelen._4_4_ = getaddrinfo(nodename,servname,(addrinfo *)hints,(addrinfo **)&cafirst);
  nodename_local._4_4_ = namelen._4_4_;
  if (namelen._4_4_ == 0) {
    for (aihead = (addrinfo *)cafirst; aihead != (addrinfo *)0x0; aihead = aihead->ai_next) {
      if (aihead->ai_canonname == (char *)0x0) {
        local_78 = 0;
      }
      else {
        local_78 = strlen(aihead->ai_canonname);
        local_78 = local_78 + 1;
      }
      pCVar1 = ca;
      if (aihead->ai_family == 2) {
        uStack_60 = 0x10;
LAB_0012a630:
        if (((aihead->ai_addr != (sockaddr *)0x0) && (aihead->ai_addrlen != 0)) &&
           (uStack_60 <= aihead->ai_addrlen)) {
          pCVar1 = (Curl_addrinfo *)(*Curl_cmalloc)(uStack_60 + 0x30 + local_78);
          if (pCVar1 == (Curl_addrinfo *)0x0) {
            namelen._4_4_ = -10;
            break;
          }
          pCVar1->ai_flags = aihead->ai_flags;
          pCVar1->ai_family = aihead->ai_family;
          pCVar1->ai_socktype = aihead->ai_socktype;
          pCVar1->ai_protocol = aihead->ai_protocol;
          pCVar1->ai_addrlen = (curl_socklen_t)uStack_60;
          pCVar1->ai_addr = (sockaddr *)0x0;
          pCVar1->ai_canonname = (char *)0x0;
          pCVar1->ai_next = (Curl_addrinfo *)0x0;
          pCVar1->ai_addr = (sockaddr *)(pCVar1 + 1);
          memcpy(pCVar1->ai_addr,aihead->ai_addr,uStack_60);
          if (local_78 != 0) {
            pCVar1->ai_canonname = pCVar1->ai_addr->sa_data + (uStack_60 - 2);
            memcpy(pCVar1->ai_canonname,aihead->ai_canonname,local_78);
          }
          if (calast == (Curl_addrinfo *)0x0) {
            calast = pCVar1;
          }
          if (ca != (Curl_addrinfo *)0x0) {
            ca->ai_next = pCVar1;
          }
        }
      }
      else if (aihead->ai_family == 10) {
        uStack_60 = 0x1c;
        goto LAB_0012a630;
      }
      ca = pCVar1;
    }
    if (cafirst != (Curl_addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)cafirst);
    }
    if (namelen._4_4_ == 0) {
      if (calast == (Curl_addrinfo *)0x0) {
        namelen._4_4_ = -2;
      }
    }
    else {
      Curl_freeaddrinfo(calast);
      calast = (Curl_addrinfo *)0x0;
    }
    *(Curl_addrinfo **)ai = calast;
    nodename_local._4_4_ = namelen._4_4_;
  }
  return nodename_local._4_4_;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    struct Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  struct Curl_addrinfo *cafirst = NULL;
  struct Curl_addrinfo *calast = NULL;
  struct Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {
    size_t namelen = ai->ai_canonname ? strlen(ai->ai_canonname) + 1 : 0;
    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef USE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if(!ai->ai_addr || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(struct Curl_addrinfo) + ss_size + namelen);
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = (void *)((char *)ca + sizeof(struct Curl_addrinfo));
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(namelen) {
      ca->ai_canonname = (void *)((char *)ca->ai_addr + ss_size);
      memcpy(ca->ai_canonname, ai->ai_canonname, namelen);
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}